

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.h
# Opt level: O0

ScriptPtr *
BinarySearch<ScriptPtr,int>(ScriptPtr *first,int max,offset_in_ScriptPtr_to_unknown keyptr,int key)

{
  int iVar1;
  int *piVar2;
  int *seekey;
  ScriptPtr *probe;
  int local_30;
  int mid;
  int min;
  int key_local;
  offset_in_ScriptPtr_to_unknown keyptr_local;
  int max_local;
  ScriptPtr *first_local;
  
  local_30 = 0;
  keyptr_local._4_4_ = max + -1;
  while( true ) {
    if (keyptr_local._4_4_ < local_30) {
      return (ScriptPtr *)0x0;
    }
    iVar1 = (local_30 + keyptr_local._4_4_) / 2;
    piVar2 = (int *)((long)&first[iVar1].Number + keyptr);
    if (*piVar2 == key) break;
    if (*piVar2 < key) {
      local_30 = iVar1 + 1;
    }
    else {
      keyptr_local._4_4_ = iVar1 + -1;
    }
  }
  return first + iVar1;
}

Assistant:

inline
const ClassType *BinarySearch (const ClassType *first, int max,
	const KeyType ClassType::*keyptr, const KeyType key)
{
	int min = 0;
	--max;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		const ClassType *probe = &first[mid];
		const KeyType &seekey = probe->*keyptr;
		if (seekey == key)
		{
			return probe;
		}
		else if (seekey < key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}